

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDtdPtr xmlCopyDtd(xmlDtdPtr dtd)

{
  int iVar1;
  xmlEntitiesTablePtr pxVar2;
  xmlNotationTablePtr pxVar3;
  xmlElementTablePtr pxVar4;
  xmlAttributeTablePtr pxVar5;
  xmlAttributePtr tmp_2;
  xmlElementPtr tmp_1;
  xmlEntityPtr tmp;
  xmlNodePtr q;
  xmlNodePtr p;
  xmlNodePtr cur;
  xmlDtdPtr ret;
  xmlDtdPtr dtd_local;
  
  q = (xmlNodePtr)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    dtd_local = (xmlDtdPtr)0x0;
  }
  else {
    dtd_local = xmlNewDtd((xmlDocPtr)0x0,dtd->name,dtd->ExternalID,dtd->SystemID);
    if (dtd_local == (xmlDtdPtr)0x0) {
      dtd_local = (xmlDtdPtr)0x0;
    }
    else {
      if (dtd->entities != (void *)0x0) {
        pxVar2 = xmlCopyEntitiesTable((xmlEntitiesTablePtr)dtd->entities);
        dtd_local->entities = pxVar2;
      }
      if (dtd->notations != (void *)0x0) {
        pxVar3 = xmlCopyNotationTable((xmlNotationTablePtr)dtd->notations);
        dtd_local->notations = pxVar3;
      }
      if (dtd->elements != (void *)0x0) {
        pxVar4 = xmlCopyElementTable((xmlElementTablePtr)dtd->elements);
        dtd_local->elements = pxVar4;
      }
      if (dtd->attributes != (void *)0x0) {
        pxVar5 = xmlCopyAttributeTable((xmlAttributeTablePtr)dtd->attributes);
        dtd_local->attributes = pxVar5;
      }
      if (dtd->pentities != (void *)0x0) {
        pxVar2 = xmlCopyEntitiesTable((xmlEntitiesTablePtr)dtd->pentities);
        dtd_local->pentities = pxVar2;
      }
      p = dtd->children;
      while (p != (xmlNodePtr)0x0) {
        tmp = (xmlEntityPtr)0x0;
        if (p->type == XML_ENTITY_DECL) {
          iVar1 = *(int *)((long)&p->properties + 4);
          if (iVar1 - 1U < 3) {
            tmp = xmlGetEntityFromDtd(dtd_local,p->name);
          }
          else if (iVar1 - 4U < 2) {
            tmp = xmlGetParameterEntityFromDtd(dtd_local,p->name);
          }
        }
        else if (p->type == XML_ELEMENT_DECL) {
          tmp = (xmlEntityPtr)xmlGetDtdQElementDesc(dtd_local,p->name,(xmlChar *)p->nsDef);
        }
        else if (p->type == XML_ATTRIBUTE_DECL) {
          tmp = (xmlEntityPtr)
                xmlGetDtdQAttrDesc(dtd_local,*(xmlChar **)&p->line,p->name,(xmlChar *)p->psvi);
        }
        else if (p->type == XML_COMMENT_NODE) {
          tmp = (xmlEntityPtr)xmlCopyNode(p,0);
        }
        if (tmp == (xmlEntityPtr)0x0) {
          p = p->next;
        }
        else {
          if (q == (xmlNodePtr)0x0) {
            dtd_local->children = (_xmlNode *)tmp;
          }
          else {
            q->next = (_xmlNode *)tmp;
          }
          tmp->prev = q;
          tmp->parent = dtd_local;
          tmp->next = (_xmlNode *)0x0;
          dtd_local->last = (_xmlNode *)tmp;
          q = (xmlNodePtr)tmp;
          p = p->next;
        }
      }
    }
  }
  return dtd_local;
}

Assistant:

xmlDtdPtr
xmlCopyDtd(xmlDtdPtr dtd) {
    xmlDtdPtr ret;
    xmlNodePtr cur, p = NULL, q;

    if (dtd == NULL) return(NULL);
    ret = xmlNewDtd(NULL, dtd->name, dtd->ExternalID, dtd->SystemID);
    if (ret == NULL) return(NULL);
    if (dtd->entities != NULL)
        ret->entities = (void *) xmlCopyEntitiesTable(
	                    (xmlEntitiesTablePtr) dtd->entities);
    if (dtd->notations != NULL)
        ret->notations = (void *) xmlCopyNotationTable(
	                    (xmlNotationTablePtr) dtd->notations);
    if (dtd->elements != NULL)
        ret->elements = (void *) xmlCopyElementTable(
	                    (xmlElementTablePtr) dtd->elements);
    if (dtd->attributes != NULL)
        ret->attributes = (void *) xmlCopyAttributeTable(
	                    (xmlAttributeTablePtr) dtd->attributes);
    if (dtd->pentities != NULL)
	ret->pentities = (void *) xmlCopyEntitiesTable(
			    (xmlEntitiesTablePtr) dtd->pentities);

    cur = dtd->children;
    while (cur != NULL) {
	q = NULL;

	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr tmp = (xmlEntityPtr) cur;
	    switch (tmp->etype) {
		case XML_INTERNAL_GENERAL_ENTITY:
		case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
		case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
		    q = (xmlNodePtr) xmlGetEntityFromDtd(ret, tmp->name);
		    break;
		case XML_INTERNAL_PARAMETER_ENTITY:
		case XML_EXTERNAL_PARAMETER_ENTITY:
		    q = (xmlNodePtr)
			xmlGetParameterEntityFromDtd(ret, tmp->name);
		    break;
		case XML_INTERNAL_PREDEFINED_ENTITY:
		    break;
	    }
	} else if (cur->type == XML_ELEMENT_DECL) {
	    xmlElementPtr tmp = (xmlElementPtr) cur;
	    q = (xmlNodePtr)
		xmlGetDtdQElementDesc(ret, tmp->name, tmp->prefix);
	} else if (cur->type == XML_ATTRIBUTE_DECL) {
	    xmlAttributePtr tmp = (xmlAttributePtr) cur;
	    q = (xmlNodePtr)
		xmlGetDtdQAttrDesc(ret, tmp->elem, tmp->name, tmp->prefix);
	} else if (cur->type == XML_COMMENT_NODE) {
	    q = xmlCopyNode(cur, 0);
	}

	if (q == NULL) {
	    cur = cur->next;
	    continue;
	}

	if (p == NULL)
	    ret->children = q;
	else
	    p->next = q;

	q->prev = p;
	q->parent = (xmlNodePtr) ret;
	q->next = NULL;
	ret->last = q;
	p = q;
	cur = cur->next;
    }

    return(ret);
}